

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

bool ON_GetGrevilleKnotVector
               (int g_stride,double *g,bool bPeriodic,int order,int cv_count,double *knot)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined4 in_register_0000000c;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  double **ppdVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  uint uVar18;
  double *pdVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double *apdStack_80 [5];
  ulong local_58;
  int local_4c;
  double *local_48;
  ulong local_40;
  double local_38;
  
  apdStack_80[4] = (double *)CONCAT44(in_register_0000000c,order);
  bVar17 = false;
  bVar2 = false;
  if (order < cv_count && order != 2 || !bPeriodic) {
    pdVar19 = (double *)(ulong)(uint)cv_count;
    bVar2 = bVar17;
    if ((((order <= cv_count) && (1 < order)) && (0 < g_stride)) &&
       ((g != (double *)0x0 && (knot != (double *)0x0)))) {
      uVar12 = order - 1;
      uVar6 = (ulong)uVar12;
      if (uVar12 == 1) {
        pdVar5 = (double *)0x0;
        do {
          knot[(long)pdVar5] = *g;
          pdVar5 = (double *)((long)pdVar5 + 1);
          g = g + (uint)g_stride;
        } while (pdVar19 != pdVar5);
        bVar2 = true;
      }
      else {
        dVar25 = 1.0 / (double)(int)uVar12;
        local_4c = order + cv_count + -2;
        uVar16 = (cv_count - order) + 2;
        if (bPeriodic) {
          local_48 = (double *)(ulong)uVar16;
          uVar18 = uVar12 >> 1 & -(uVar12 & 1);
          apdStack_80[3] = (double *)(ulong)(uVar12 * 2);
          iVar3 = uVar16 + uVar12 * 2;
          local_58 = CONCAT44(local_58._4_4_,iVar3);
          apdStack_80[0] = (double *)0x4bc97e;
          local_40 = uVar6;
          local_38 = dVar25;
          pdVar5 = (double *)onmalloc((long)iVar3 << 3);
          iVar3 = (int)apdStack_80[4];
          iVar15 = (int)local_40;
          uVar6 = local_40 & 0xffffffff;
          uVar9 = 0;
          do {
            pdVar5[uVar9] =
                 (*g - g[(long)(int)uVar16 + -1]) + g[(long)(int)(uVar16 - iVar3) + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
          iVar13 = (int)local_48;
          if (0 < iVar13) {
            uVar9 = 0;
            do {
              pdVar5[uVar6 + uVar9] = g[uVar9];
              uVar9 = uVar9 + 1;
            } while (((ulong)local_48 & 0xffffffff) != uVar9);
          }
          if (iVar13 + iVar15 < (int)local_58) {
            uVar9 = 1;
            do {
              pdVar5[(long)(iVar13 + iVar15) + (uVar9 - 1)] = (g[(long)iVar13 + -1] - *g) + g[uVar9]
              ;
              uVar9 = uVar9 + 1;
            } while ((cv_count - iVar13) + 2 != uVar9);
          }
          uVar12 = iVar13 + iVar3;
          if (uVar12 != 0 && SCARRY4(iVar13,iVar3) == (int)uVar12 < 0) {
            uVar9 = 0;
            pdVar10 = pdVar5;
            do {
              dVar25 = pdVar5[uVar9];
              dVar20 = dVar25;
              if (2 < iVar3) {
                uVar14 = 1;
                do {
                  dVar20 = dVar20 + pdVar10[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar6 != uVar14);
              }
              dVar20 = dVar20 * local_38;
              if ((uVar18 != 0) &&
                 (ABS(dVar20 - pdVar5[uVar18 + uVar9]) <=
                  (pdVar5[(long)iVar15 + (uVar9 - 1)] - dVar25) * 1.490116119385e-08)) {
                dVar20 = pdVar5[uVar18 + uVar9];
              }
              pdVar5[uVar9] = dVar20;
              uVar9 = uVar9 + 1;
              pdVar10 = pdVar10 + 1;
            } while (uVar9 != uVar12);
          }
          lVar11 = -((ulong)(uint)(iVar3 * iVar3) * 8 + 0xf & 0x3fffffff0);
          ppdVar8 = (double **)((long)apdStack_80 + lVar11 + 8U);
          lVar4 = 0;
          local_48 = (double *)ppdVar8;
          if (iVar15 != 0) {
            local_58 = 0;
            iVar3 = (int)apdStack_80[3];
            uVar6 = (ulong)iVar15;
            local_38 = 0.0;
            uVar9 = 0;
            pdVar10 = apdStack_80[4];
            apdStack_80[1] = knot;
            apdStack_80[2] = pdVar19;
            apdStack_80[3] = pdVar5;
            local_40 = uVar6;
            do {
              pdVar19 = local_48;
              dVar25 = *g;
              if (dVar25 < pdVar5[uVar6] || dVar25 == pdVar5[uVar6]) {
                if (dVar25 < pdVar5[uVar6 - 1]) break;
                *(undefined8 *)((long)apdStack_80 + lVar11) = 0x4bcb74;
                ON_EvaluateNurbsBasis((int)pdVar10,pdVar5,dVar25,pdVar19);
                dVar25 = *pdVar19;
                uVar6 = local_40;
                knot = apdStack_80[1];
                pdVar10 = apdStack_80[4];
                if (local_38 < dVar25) {
                  local_58 = uVar9 & 0xffffffff;
                  local_38 = dVar25;
                }
              }
              uVar9 = uVar9 + 1;
              pdVar5 = pdVar5 + 1;
            } while (iVar3 + (uint)(iVar3 == 0) != uVar9);
            lVar4 = (long)(int)local_58;
            cv_count = (int)apdStack_80[2];
            pdVar5 = apdStack_80[3];
          }
          lVar7 = (long)local_4c;
          *(undefined8 *)((long)apdStack_80 + lVar11) = 0x4bcbcc;
          memcpy(knot,pdVar5 + lVar4,lVar7 << 3);
          pdVar19 = apdStack_80[4];
          *(undefined8 *)((long)apdStack_80 + lVar11) = 0x4bcbdb;
          bVar2 = ON_MakeKnotVectorPeriodic((int)pdVar19,cv_count,knot);
        }
        else {
          if (g < knot + local_4c && knot < g) {
            local_48 = (double *)(ulong)(uint)g_stride;
            apdStack_80[0] = (double *)0x4bcc1b;
            local_40 = uVar6;
            local_38 = dVar25;
            pdVar5 = (double *)onmalloc((ulong)(uint)cv_count * 8);
            uVar6 = 0;
            do {
              pdVar5[uVar6] = *g;
              uVar6 = uVar6 + 1;
              g = g + ((ulong)local_48 & 0xffffffff);
            } while ((uint)cv_count != uVar6);
            g_stride = 1;
            uVar6 = local_40;
            g = pdVar5;
            dVar25 = local_38;
          }
          else {
            pdVar5 = (double *)0x0;
            local_48 = pdVar19;
          }
          auVar1 = _DAT_0069b120;
          dVar20 = *g;
          uVar14 = uVar6 & 0xffffffff;
          lVar11 = uVar14 - 1;
          auVar21._8_4_ = (int)lVar11;
          auVar21._0_8_ = lVar11;
          auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
          uVar9 = 0;
          auVar21 = auVar21 ^ _DAT_0069b120;
          auVar22 = _DAT_0069b170;
          do {
            auVar24 = auVar22 ^ auVar1;
            if ((bool)(~(auVar24._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar24._0_4_ ||
                        auVar21._4_4_ < auVar24._4_4_) & 1)) {
              knot[uVar9] = dVar20;
            }
            if ((auVar24._12_4_ != auVar21._12_4_ || auVar24._8_4_ <= auVar21._8_4_) &&
                auVar24._12_4_ <= auVar21._12_4_) {
              knot[uVar9 + 1] = dVar20;
            }
            uVar9 = uVar9 + 2;
            lVar11 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 2;
            auVar22._8_8_ = lVar11 + 2;
          } while ((uVar14 + 1 & 0xfffffffffffffffe) != uVar9);
          bVar2 = true;
          lVar11 = (long)(int)uVar6;
          pdVar19 = g;
          do {
            pdVar19 = pdVar19 + g_stride;
            dVar20 = 0.0;
            uVar9 = uVar14;
            pdVar10 = pdVar19;
            do {
              dVar20 = dVar20 + *pdVar10;
              pdVar10 = pdVar10 + g_stride;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
            dVar20 = dVar20 * dVar25;
            knot[lVar11] = dVar20;
            auVar22 = _DAT_0069b170;
            if ((dVar20 < knot[lVar11 + -1]) || (dVar20 <= knot[lVar11 - (int)uVar6])) {
              bVar2 = false;
            }
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 != cv_count);
          ppdVar8 = apdStack_80 + 1;
          if (cv_count <= local_4c) {
            uVar16 = cv_count - 1;
            dVar25 = g[(int)(g_stride * uVar16)];
            uVar12 = (int)apdStack_80[4] - 2;
            auVar24._4_4_ = 0;
            auVar24._0_4_ = uVar12;
            auVar24._8_4_ = uVar12;
            auVar24._12_4_ = 0;
            uVar6 = 0;
            auVar24 = auVar24 ^ auVar1;
            do {
              auVar23._8_4_ = (int)uVar6;
              auVar23._0_8_ = uVar6;
              auVar23._12_4_ = (int)(uVar6 >> 0x20);
              auVar21 = (auVar23 | auVar22) ^ auVar1;
              if ((bool)(~(auVar21._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar21._0_4_ ||
                          auVar24._4_4_ < auVar21._4_4_) & 1)) {
                knot[uVar16 + uVar6] = dVar25;
              }
              if ((auVar21._12_4_ != auVar24._12_4_ || auVar21._8_4_ <= auVar24._8_4_) &&
                  auVar21._12_4_ <= auVar24._12_4_) {
                knot[(ulong)uVar16 + uVar6 + 1] = dVar25;
              }
              uVar6 = uVar6 + 2;
              ppdVar8 = apdStack_80 + 1;
            } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar6);
          }
        }
        if (pdVar5 != (double *)0x0) {
          ppdVar8[-1] = (double *)0x4bce1f;
          onfree(pdVar5);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_GetGrevilleKnotVector( // get knots from Greville abcissa
          int g_stride,     
          const double *g,  // if not periodic, g[cv_count], 
                            // if periodic, g[cv_count-order+2]
                            // usually, g[0] = 0, g[i] = |P[i]-P[i-1]|^q
          bool bPeriodic,
          int order, 
          int cv_count, 
          double* knot
          )
{
  bool rc = false;
  double* p = nullptr;
  int ki, knot_count, g_count, gi, j, degree;
  double k, dd;

  if ( g_stride < 1 || !g || !knot || order < 2 || cv_count < order )
    return false;
  if ( bPeriodic && order == 2 )
    return false;
  if ( bPeriodic && cv_count - order + 2 < 3 )
    return false;

  degree = order-1;
  if ( degree == 1 ) {
    for ( j = 0; j < cv_count; j++ ) {
      knot[j] = g[j*g_stride];
    }
    return true;
  }
  dd = 1.0/degree;
  knot_count = ON_KnotCount( order, cv_count );
  g_count = (bPeriodic) ? cv_count-order+2 : cv_count;

  if ( bPeriodic ) {
    int half_degree = (degree%2) ? degree/2 : 0;
    // step 1: set p[] = fully periodic list of abcissa
    p = (double*)onmalloc((g_count + 2*degree)*sizeof(*p));
    for ( j = 0, gi = g_count-order; j < degree; j++, gi++ ) {
      p[j] = g[0] - g[g_count-1] + g[gi];
    }
    for ( gi = 0, j = degree; gi < g_count; gi++, j++ ) {
      p[j] = g[gi];
    }
    for ( j = g_count+degree, gi = 1; j < g_count+2*degree; j++, gi++ ) {
      p[j] = g[g_count-1] - g[0] + g[gi];
    }

    // step 2: set new p[i] = old (p[i] + ... + p[i+degree-1]) / degree
    for ( j = 0; j < g_count+order; j++ ) {
      k = p[j];
      for ( ki = 1; ki < degree; ki++ ) 
        k += p[j+ki];
      k *= dd;
      if ( half_degree ) {
        // if g[]'s are uniform and degree is odd, then knots = g[]'s
        if ( fabs(k-p[j+half_degree]) <=  ON_SQRT_EPSILON*(p[j+degree-1]-p[j]) )
          k = p[j+half_degree];
      }
      p[j] = k;
    }

    // step 3: determine where g[0] maximizes NURBS basis functions
    {
      double* B = (double*)alloca(order*order*sizeof(B[0]));
      double maxB  = 0.0;
      int maxBj = 0;
      for ( j = 0; j < 2*degree; j++ ) {
        if ( g[0] > p[j+degree] )
          continue;
        if ( g[0] < p[j+degree-1] )
          break;
        ON_EvaluateNurbsBasis( order, p+j, g[0], B );
        if ( B[0] > maxB ) {
          maxB  = B[0];
          maxBj = j;
        }
      }
      memcpy( knot, &p[maxBj], knot_count*sizeof(*knot) );
    }

    rc = ON_MakeKnotVectorPeriodic( order, cv_count, knot );
  }
  else {
    // clamped knots
    rc = true;
    if ( g > knot && g < knot+knot_count ) {
      p = (double*)onmalloc(cv_count*sizeof(*p));
      for( j = 0; j < cv_count; j++ ) {
        p[j] = g[j*g_stride];
      }
      g = p;
      g_stride = 1;
    }
    for ( ki = 0; ki < degree; ki++ ) {
      knot[ki] = g[0];
    }
    for ( ki = degree, gi = 1; ki < cv_count; ki++, gi++ ) {
      k = 0.0;
      for ( j = 0; j < degree; j++ ) {
        k += g[(gi+j)*g_stride];
      }
      knot[ki] = k*dd;
      if ( knot[ki] < knot[ki-1] || knot[ki] <= knot[ki-degree] ) {
        rc = false;
      }
    }
    for ( ki = cv_count-1; ki < knot_count; ki++ ) {
      knot[ki] = g[(cv_count-1)*g_stride];
    }
  }

  if (p)
    onfree(p);
  return rc;
}